

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::EagerPromiseNodeBase::tracePromise
          (EagerPromiseNodeBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  undefined7 in_register_00000011;
  
  if (((int)CONCAT71(in_register_00000011,stopAtNextEvent) == 0) &&
     (pPVar1 = (this->dependency).ptr, pPVar1 != (PromiseNode *)0x0)) {
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,0);
    return;
  }
  return;
}

Assistant:

void EagerPromiseNodeBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // TODO(debug): Maybe use __builtin_return_address to get the locations that called
  //   eagerlyEvaluate()? But note that if a non-null exception handler was passed to it, that
  //   creates a TransformPromiseNode which will report the location anyhow.

  if (stopAtNextEvent) return;
  if (dependency.get() != nullptr) {
    dependency->tracePromise(builder, stopAtNextEvent);
  }
}